

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjComputePathR(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int local_20;
  int local_1c;
  int Path;
  int k;
  int iFanout;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_20 = 0;
  iVar1 = Acb_ObjIsCo(p,iObj);
  if (iVar1 == 0) {
    local_1c = 0;
    while( true ) {
      pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar1 = Vec_IntSize(pVVar4);
      if (iVar1 <= local_1c) break;
      pVVar4 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar1 = Vec_IntEntry(pVVar4,local_1c);
      AVar2 = Acb_ObjType(p,iVar1);
      if ((AVar2 != ABC_OPER_NONE) && (iVar3 = Acb_ObjSlack(p,iVar1), iVar3 == 0)) {
        iVar1 = Acb_ObjPathR(p,iVar1);
        local_20 = iVar1 + local_20;
      }
      local_1c = local_1c + 1;
    }
    iVar1 = Acb_ObjSetPathR(p,iObj,local_20);
    return iVar1;
  }
  __assert_fail("!Acb_ObjIsCo(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0xe1,"int Acb_ObjComputePathR(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjComputePathR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Path = 0;
    assert( !Acb_ObjIsCo(p, iObj) );
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        if ( !Acb_ObjSlack(p, iFanout) )
            Path += Acb_ObjPathR(p, iFanout);
    return Acb_ObjSetPathR( p, iObj, Path );
}